

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_verifier.cpp
# Opt level: O2

void __thiscall
duckdb::StatementVerifier::StatementVerifier
          (StatementVerifier *this,VerificationType type,string *name,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement_p,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters_p)

{
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  int iVar2;
  pointer pSVar3;
  pointer pQVar4;
  undefined4 extraout_var;
  
  this->_vptr_StatementVerifier = (_func_int **)&PTR__StatementVerifier_027c4790;
  this->type = type;
  ::std::__cxx11::string::string((string *)&this->name,(string *)name);
  _Var1._M_head_impl =
       (SelectStatement *)
       (statement_p->
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (statement_p->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
  _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  (this->statement).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var1._M_head_impl;
  (this->parameters).ptr = parameters_p.ptr;
  pSVar3 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->(&this->statement);
  pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     (&pSVar3->node);
  iVar2 = (*pQVar4->_vptr_QueryNode[2])(pQVar4);
  this->select_list =
       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
        *)CONCAT44(extraout_var,iVar2);
  (this->materialized_result).
  super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
  .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
       (MaterializedQueryResult *)0x0;
  return;
}

Assistant:

StatementVerifier::StatementVerifier(VerificationType type, string name, unique_ptr<SQLStatement> statement_p,
                                     optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters_p)
    : type(type), name(std::move(name)),
      statement(unique_ptr_cast<SQLStatement, SelectStatement>(std::move(statement_p))), parameters(parameters_p),
      select_list(statement->node->GetSelectList()) {
}